

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseBuilder::onAttach(BaseBuilder *this,CodeHolder *code)

{
  Error EVar1;
  SectionNode *initialSection;
  
  EVar1 = BaseEmitter::onAttach(&this->super_BaseEmitter,code);
  if (EVar1 == 0) {
    EVar1 = sectionNodeOf(this,&initialSection,0);
    if ((EVar1 == 0) &&
       (EVar1 = ZoneVector<asmjit::v1_14::Pass_*>::willGrow(&this->_passes,&this->_allocator,8),
       EVar1 == 0)) {
      this->_cursor = (BaseNode *)initialSection;
      *(SectionNode **)&this->_nodeList = initialSection;
      *(SectionNode **)&this->field_0x1a8 = initialSection;
      initialSection[0x11] = (SectionNode)0x80;
      EVar1 = 0;
    }
    else {
      (*(this->super_BaseEmitter)._vptr_BaseEmitter[0x11])(this,code);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  SectionNode* initialSection;
  Error err = sectionNodeOf(&initialSection, 0);

  if (!err)
    err = _passes.willGrow(&_allocator, 8);

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  ASMJIT_ASSUME(initialSection != nullptr);
  _cursor = initialSection;
  _nodeList.reset(initialSection, initialSection);
  initialSection->setFlags(NodeFlags::kIsActive);

  return kErrorOk;
}